

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O3

el_status_t h_search(void)

{
  long lVar1;
  char c;
  el_status_t eVar2;
  char *p;
  code *pcVar3;
  long lVar4;
  
  if (Searching == '\x01') {
    tty_put('\a');
    tty_flush();
  }
  else {
    Searching = '\x01';
    clear_line();
    old_prompt = rl_prompt;
    rl_prompt = "Search: ";
    c = 'S';
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      tty_put(c);
      c = "Search: "[lVar4 + 1];
      lVar4 = lVar1;
    } while (lVar1 != 8);
    pcVar3 = el_next_hist;
    if (Repeat == -1) {
      pcVar3 = el_prev_hist;
    }
    search_move = pcVar3;
    if (line_handler == (rl_vcpfunc_t *)0x0) {
      p = editinput(1);
      eVar2 = h_search_end(p);
      return eVar2;
    }
    editinput(0);
  }
  return CSstay;
}

Assistant:

static el_status_t h_search(void)
{
    if (Searching)
        return el_ring_bell();
    Searching = 1;

    clear_line();
    old_prompt = rl_prompt;
    rl_prompt = "Search: ";
    tty_puts(rl_prompt);

    search_move = Repeat == NO_ARG ? el_prev_hist : el_next_hist;
    if (line_handler) {
        editinput(0);
        return CSstay;
    }

    return h_search_end(editinput(1));
}